

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSoftRigidDynamicsWorld.cpp
# Opt level: O3

void __thiscall
btSoftSingleRayCallback::btSoftSingleRayCallback
          (btSoftSingleRayCallback *this,btVector3 *rayFromWorld,btVector3 *rayToWorld,
          btSoftRigidDynamicsWorld *world,RayResultCallback *resultCallback)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  btMatrix3x3 *pbVar4;
  btVector3 *pbVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  undefined1 auVar11 [16];
  float fVar12;
  
  (this->super_btBroadphaseRayCallback).super_btBroadphaseAabbCallback.
  _vptr_btBroadphaseAabbCallback = (_func_int **)&PTR__btBroadphaseAabbCallback_00221c88;
  uVar1 = *(undefined8 *)rayFromWorld->m_floats;
  uVar2 = *(undefined8 *)(rayFromWorld->m_floats + 2);
  *(undefined8 *)(this->m_rayFromWorld).m_floats = uVar1;
  *(undefined8 *)((this->m_rayFromWorld).m_floats + 2) = uVar2;
  uVar3 = *(undefined8 *)(rayToWorld->m_floats + 2);
  *(undefined8 *)(this->m_rayToWorld).m_floats = *(undefined8 *)rayToWorld->m_floats;
  *(undefined8 *)((this->m_rayToWorld).m_floats + 2) = uVar3;
  this->m_world = world;
  this->m_resultCallback = resultCallback;
  (this->m_rayFromTrans).m_basis.m_el[0].m_floats[0] = 1.0;
  pbVar4 = &(this->m_rayFromTrans).m_basis;
  pbVar4->m_el[0].m_floats[1] = 0.0;
  pbVar4->m_el[0].m_floats[2] = 0.0;
  *(undefined8 *)((this->m_rayFromTrans).m_basis.m_el[0].m_floats + 3) = 0;
  (this->m_rayFromTrans).m_basis.m_el[1].m_floats[1] = 1.0;
  pbVar5 = (this->m_rayFromTrans).m_basis.m_el;
  pbVar5[1].m_floats[2] = 0.0;
  pbVar5[1].m_floats[3] = 0.0;
  pbVar4 = &(this->m_rayFromTrans).m_basis;
  pbVar4->m_el[2].m_floats[0] = 0.0;
  pbVar4->m_el[2].m_floats[1] = 0.0;
  pbVar5 = (this->m_rayFromTrans).m_basis.m_el;
  pbVar5[2].m_floats[2] = 1.0;
  pbVar5[2].m_floats[3] = 0.0;
  *(undefined8 *)(this->m_rayFromTrans).m_origin.m_floats = uVar1;
  *(undefined8 *)((this->m_rayFromTrans).m_origin.m_floats + 2) = uVar2;
  (this->m_rayToTrans).m_basis.m_el[0].m_floats[0] = 1.0;
  pbVar4 = &(this->m_rayToTrans).m_basis;
  pbVar4->m_el[0].m_floats[1] = 0.0;
  pbVar4->m_el[0].m_floats[2] = 0.0;
  *(undefined8 *)((this->m_rayToTrans).m_basis.m_el[0].m_floats + 3) = 0;
  (this->m_rayToTrans).m_basis.m_el[1].m_floats[1] = 1.0;
  pbVar5 = (this->m_rayToTrans).m_basis.m_el;
  pbVar5[1].m_floats[2] = 0.0;
  pbVar5[1].m_floats[3] = 0.0;
  pbVar4 = &(this->m_rayToTrans).m_basis;
  pbVar4->m_el[2].m_floats[0] = 0.0;
  pbVar4->m_el[2].m_floats[1] = 0.0;
  pbVar5 = (this->m_rayToTrans).m_basis.m_el;
  pbVar5[2].m_floats[2] = 1.0;
  pbVar5[2].m_floats[3] = 0.0;
  uVar1 = *(undefined8 *)((this->m_rayToWorld).m_floats + 2);
  *(undefined8 *)(this->m_rayToTrans).m_origin.m_floats =
       *(undefined8 *)(this->m_rayToWorld).m_floats;
  *(undefined8 *)((this->m_rayToTrans).m_origin.m_floats + 2) = uVar1;
  fVar6 = rayToWorld->m_floats[2] - rayFromWorld->m_floats[2];
  fVar8 = (float)*(undefined8 *)rayToWorld->m_floats - (float)*(undefined8 *)rayFromWorld->m_floats;
  fVar9 = (float)((ulong)*(undefined8 *)rayToWorld->m_floats >> 0x20) -
          (float)((ulong)*(undefined8 *)rayFromWorld->m_floats >> 0x20);
  fVar7 = 1.0 / SQRT(fVar6 * fVar6 + fVar8 * fVar8 + fVar9 * fVar9);
  fVar6 = fVar6 * fVar7;
  fVar8 = fVar7 * fVar8;
  fVar9 = fVar7 * fVar9;
  auVar11._4_4_ = fVar9;
  auVar11._0_4_ = fVar8;
  auVar11._8_4_ = fVar7 * 0.0;
  auVar11._12_4_ = fVar7 * 0.0;
  auVar11 = divps(_DAT_001ee3f0,auVar11);
  fVar7 = (float)(-(uint)(fVar8 == 0.0) & 0x7149f2ca | ~-(uint)(fVar8 == 0.0) & auVar11._0_4_);
  fVar10 = (float)(-(uint)(fVar9 == 0.0) & 0x7149f2ca | ~-(uint)(fVar9 == 0.0) & auVar11._4_4_);
  (this->super_btBroadphaseRayCallback).m_rayDirectionInverse.m_floats[0] = fVar7;
  (this->super_btBroadphaseRayCallback).m_rayDirectionInverse.m_floats[1] = fVar10;
  fVar12 = (float)(-(uint)(fVar6 == 0.0) & 0x7149f2ca | ~-(uint)(fVar6 == 0.0) & (uint)(1.0 / fVar6)
                  );
  (this->super_btBroadphaseRayCallback).m_rayDirectionInverse.m_floats[2] = fVar12;
  *(ulong *)(this->super_btBroadphaseRayCallback).m_signs =
       CONCAT44(-(uint)(fVar10 < 0.0),-(uint)(fVar7 < 0.0)) & 0x100000001;
  (this->super_btBroadphaseRayCallback).m_signs[2] = (uint)(fVar12 < 0.0);
  (this->super_btBroadphaseRayCallback).m_lambda_max =
       ((this->m_rayToWorld).m_floats[2] - (this->m_rayFromWorld).m_floats[2]) * fVar6 +
       ((this->m_rayToWorld).m_floats[0] - (this->m_rayFromWorld).m_floats[0]) * fVar8 +
       fVar9 * ((this->m_rayToWorld).m_floats[1] - (this->m_rayFromWorld).m_floats[1]);
  return;
}

Assistant:

btSoftSingleRayCallback(const btVector3& rayFromWorld,const btVector3& rayToWorld,const btSoftRigidDynamicsWorld* world,btCollisionWorld::RayResultCallback& resultCallback)
	:m_rayFromWorld(rayFromWorld),
	m_rayToWorld(rayToWorld),
	m_world(world),
	m_resultCallback(resultCallback)
	{
		m_rayFromTrans.setIdentity();
		m_rayFromTrans.setOrigin(m_rayFromWorld);
		m_rayToTrans.setIdentity();
		m_rayToTrans.setOrigin(m_rayToWorld);

		btVector3 rayDir = (rayToWorld-rayFromWorld);

		rayDir.normalize ();
		///what about division by zero? --> just set rayDirection[i] to INF/1e30
		m_rayDirectionInverse[0] = rayDir[0] == btScalar(0.0) ? btScalar(1e30) : btScalar(1.0) / rayDir[0];
		m_rayDirectionInverse[1] = rayDir[1] == btScalar(0.0) ? btScalar(1e30) : btScalar(1.0) / rayDir[1];
		m_rayDirectionInverse[2] = rayDir[2] == btScalar(0.0) ? btScalar(1e30) : btScalar(1.0) / rayDir[2];
		m_signs[0] = m_rayDirectionInverse[0] < 0.0;
		m_signs[1] = m_rayDirectionInverse[1] < 0.0;
		m_signs[2] = m_rayDirectionInverse[2] < 0.0;

		m_lambda_max = rayDir.dot(m_rayToWorld-m_rayFromWorld);

	}